

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Graph::setBoundaries(Graph *this)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  reference ppEVar4;
  vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
  *in_RDI;
  int node;
  reference in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar5;
  
  iVar5 = 0;
  do {
    if (*(int *)&in_RDI[7].
                 super__Vector_base<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish <= iVar5) {
      return;
    }
    pvVar2 = std::
             vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
             ::operator[](in_RDI,(long)iVar5);
    sVar3 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size(pvVar2);
    if (sVar3 == 2) {
      pvVar2 = std::
               vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
               ::operator[](in_RDI,(long)iVar5);
      ppEVar4 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[](pvVar2,0);
      iVar1 = (*ppEVar4)->ttd;
      pvVar2 = std::
               vector<std::vector<Edge_*,_std::allocator<Edge_*>_>,_std::allocator<std::vector<Edge_*,_std::allocator<Edge_*>_>_>_>
               ::operator[](in_RDI,(long)iVar5);
      ppEVar4 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[](pvVar2,1);
      if (iVar1 != (*ppEVar4)->ttd) goto LAB_0011bb1d;
    }
    else {
LAB_0011bb1d:
      in_stack_ffffffffffffffe0 =
           std::vector<bool,_std::allocator<bool>_>::operator[]
                     ((vector<bool,_std::allocator<bool>_> *)
                      CONCAT44(iVar5,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe0._M_mask);
      std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffe0,true);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Graph::setBoundaries() {
  for(int node = 0; node < vertexCount; node++) {
    if(adjList[node].size() != 2 || adjList[node][0]->ttd != adjList[node][1]->ttd ) {
      isBoundaryList[node] = true;
    }
    
  }
  
}